

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.c
# Opt level: O0

Expr gc_collect_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                       Expr *args,int argc)

{
  Expr EVar1;
  undefined1 local_78 [8];
  Expr arr [3];
  int objects;
  int pairs;
  int atoms;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr res;
  
  pairs = argc;
  _atoms = args;
  args_local = (Expr *)callContext;
  callContext_local = defContext;
  defContext_local = (pContext_conflict)exec;
  if (argc != 0) {
    printf("gc-collect: too many arguments\n");
    exit(1);
  }
  gc_collectv(exec,&objects,(int *)((long)&arr[2].field_1 + 4),(int *)&arr[2].field_1.val_char);
  EVar1 = make_int_from_long((pExecutor)defContext_local,(long)objects);
  arr[0]._0_8_ = EVar1.field_1;
  local_78._0_4_ = EVar1.type;
  EVar1 = make_int_from_long((pExecutor)defContext_local,(long)(int)arr[2].field_1._4_4_);
  arr[1]._0_8_ = EVar1.field_1;
  arr[0].field_1._0_4_ = EVar1.type;
  EVar1 = make_int_from_long((pExecutor)defContext_local,(long)(int)arr[2].field_1._0_4_);
  arr[2]._0_8_ = EVar1.field_1;
  arr[1].field_1._0_4_ = EVar1.type;
  EVar1 = make_list((pExecutor)defContext_local,(Expr *)local_78,3);
  EVar1._4_4_ = 0;
  return EVar1;
}

Assistant:

BUILTIN_FUNC(gc_collect_builtin)
{
    if (argc != 0)
    {
        log("gc-collect: too many arguments");
        exit(1);
    }
    int atoms, pairs, objects;
    gc_collectv(exec, &atoms, &pairs, &objects);
    Expr arr[3] =
            {
                    make_int_from_long(exec, atoms),
                    make_int_from_long(exec, pairs),
                    make_int_from_long(exec, objects)
            };
    Expr res = make_list(exec, arr, 3);
    return res;
}